

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

void qt_bitmapblit_template<unsigned_int>
               (QRasterBuffer *rasterBuffer,int x,int y,uint color,uchar *map,int mapWidth,
               int mapHeight,int mapStride)

{
  int in_EDX;
  QRasterBuffer *in_RDI;
  undefined1 *in_R8;
  int in_R9D;
  uchar s_1;
  int n_1;
  int x0_1;
  int i;
  uchar s;
  int x_1;
  int n;
  int x0;
  int destStride;
  uint *dest;
  quint32 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar1;
  undefined4 in_stack_ffffffffffffffb4;
  int iVar2;
  int local_48;
  byte local_41;
  int local_40;
  int local_3c;
  undefined1 *local_20;
  
  QRasterBuffer::scanLine(in_RDI,in_EDX);
  QRasterBuffer::stride<unsigned_int>(in_RDI);
  local_20 = in_R8;
  if (in_R9D < 9) {
    while (n_1 = n_1 + -1, -1 < n_1) {
      iVar2 = 0;
      iVar1 = 0;
      for (in_stack_ffffffffffffffac = CONCAT13(*local_20,(int3)in_stack_ffffffffffffffac);
          (char)(in_stack_ffffffffffffffac >> 0x18) != '\0';
          in_stack_ffffffffffffffac =
               CONCAT13((char)(in_stack_ffffffffffffffac >> 0x18) << 1,
                        (int3)in_stack_ffffffffffffffac)) {
        if ((in_stack_ffffffffffffffac & 0x80000000) == 0) {
          if (iVar1 == 0) {
            iVar2 = iVar2 + 1;
          }
          else {
            qt_memfill<unsigned_int>
                      ((quint32 *)CONCAT44(iVar2,iVar1),in_stack_ffffffffffffffac,0xb77e09);
            iVar2 = iVar1 + 1 + iVar2;
            iVar1 = 0;
          }
        }
        else {
          iVar1 = iVar1 + 1;
        }
      }
      if (iVar1 != 0) {
        qt_memfill<unsigned_int>
                  ((quint32 *)CONCAT44(iVar2,iVar1),in_stack_ffffffffffffffac,0xb77e64);
      }
      local_20 = local_20 + i;
    }
  }
  else {
    while (n_1 = n_1 + -1, -1 < n_1) {
      local_3c = 0;
      for (local_40 = 0; local_40 < in_R9D; local_40 = local_40 + 8) {
        local_41 = local_20[local_40 >> 3];
        for (local_48 = 0; local_48 < 8; local_48 = local_48 + 1) {
          if ((local_41 & 0x80) == 0) {
            if (local_3c != 0) {
              qt_memfill<unsigned_int>
                        ((quint32 *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                         in_stack_ffffffffffffffac,0xb77cc6);
              local_3c = 0;
            }
            if (local_41 == 0) break;
          }
          else {
            local_3c = local_3c + 1;
          }
          local_41 = local_41 << 1;
        }
      }
      if (local_3c != 0) {
        qt_memfill<unsigned_int>
                  ((quint32 *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffac,0xb77d59);
      }
      local_20 = local_20 + i;
    }
  }
  return;
}

Assistant:

static
inline void qt_bitmapblit_template(QRasterBuffer *rasterBuffer,
                                   int x, int y, DST color,
                                   const uchar *map,
                                   int mapWidth, int mapHeight, int mapStride)
{
    DST *dest = reinterpret_cast<DST *>(rasterBuffer->scanLine(y)) + x;
    const int destStride = rasterBuffer->stride<DST>();

    if (mapWidth > 8) {
        while (--mapHeight >= 0) {
            int x0 = 0;
            int n = 0;
            for (int x = 0; x < mapWidth; x += 8) {
                uchar s = map[x >> 3];
                for (int i = 0; i < 8; ++i) {
                    if (s & 0x80) {
                        ++n;
                    } else {
                        if (n) {
                            qt_memfill(dest + x0, color, n);
                            x0 += n + 1;
                            n = 0;
                        } else {
                            ++x0;
                        }
                        if (!s) {
                            x0 += 8 - 1 - i;
                            break;
                        }
                    }
                    s <<= 1;
                }
            }
            if (n)
                qt_memfill(dest + x0, color, n);
            dest += destStride;
            map += mapStride;
        }
    } else {
        while (--mapHeight >= 0) {
            int x0 = 0;
            int n = 0;
            for (uchar s = *map; s; s <<= 1) {
                if (s & 0x80) {
                    ++n;
                } else if (n) {
                    qt_memfill(dest + x0, color, n);
                    x0 += n + 1;
                    n = 0;
                } else {
                    ++x0;
                }
            }
            if (n)
                qt_memfill(dest + x0, color, n);
            dest += destStride;
            map += mapStride;
        }
    }
}